

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module_exposed_annotated_type.cpp
# Opt level: O0

int main(void)

{
  unique_ptr<i1,_std::default_delete<i1>_> *this;
  pointer piVar1;
  long local_68;
  undefined1 local_38 [8];
  unique_ptr<T,_std::default_delete<T>_> object;
  undefined1 local_20 [8];
  i injector;
  
  injector.super_injector_t._12_4_ = 0;
  anon_class_1_0_00000001::operator()
            ((injector<_::boost::ext::di::v1_3_0::named<decltype(::boost::ext::di::v1_3_0::detail::named___my_name),_std::unique_ptr<i1>_>_>
              *)&object,(anon_class_1_0_00000001 *)&module);
  boost::ext::di::v1_3_0::
  make_injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::detail::injector<boost::ext::di::v1_3_0::config,_int,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>,_0,_0>
            ((i *)local_20,
             (injector<_::boost::ext::di::v1_3_0::named<decltype(::boost::ext::di::v1_3_0::detail::named___my_name),_std::unique_ptr<i1>_>_>
              *)&object);
  boost::ext::di::v1_3_0::detail::
  injector<boost::ext::di::v1_3_0::config,_int,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
  ::~injector((injector<_::boost::ext::di::v1_3_0::named<decltype(::boost::ext::di::v1_3_0::detail::named___my_name),_std::unique_ptr<i1>_>_>
               *)&object);
  boost::ext::di::v1_3_0::core::
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::detail::injector<boost::ext::di::v1_3_0::config,_int,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>
  ::create<std::unique_ptr<T,_std::default_delete<T>_>,_0>
            ((injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::detail::injector<boost::ext::di::v1_3_0::config,_int,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>
              *)local_38);
  this = &std::unique_ptr<T,_std::default_delete<T>_>::operator->
                    ((unique_ptr<T,_std::default_delete<T>_> *)local_38)->up;
  piVar1 = std::unique_ptr<i1,_std::default_delete<i1>_>::get(this);
  if (piVar1 == (pointer)0x0) {
    local_68 = 0;
  }
  else {
    local_68 = __dynamic_cast(piVar1,&i1::typeinfo,&impl1::typeinfo,0);
  }
  if (local_68 != 0) {
    std::unique_ptr<T,_std::default_delete<T>_>::~unique_ptr
              ((unique_ptr<T,_std::default_delete<T>_> *)local_38);
    boost::ext::di::v1_3_0::detail::anon_class_1_0_00000001::
    operator()<boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::detail::injector<boost::ext::di::v1_3_0::config,_int,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>_>
    ::i::~i((i *)local_20);
    return injector.super_injector_t._12_4_;
  }
  __assert_fail("dynamic_cast<impl1*>(object->up.get())",
                "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp"
                ,0x29,"int main()");
}

Assistant:

int main() {
  auto injector = di::make_injector(module());
  auto object = injector.create<std::unique_ptr<T>>();
  assert(dynamic_cast<impl1*>(object->up.get()));
}